

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

SynShortFunctionDefinition * ParseShortFunctionDefinition(ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  SynIdentifier *this;
  undefined4 extraout_var_00;
  SynShortFunctionArgument *node;
  SynBase *node_00;
  undefined4 extraout_var_02;
  Lexeme *pLVar4;
  char *pcVar5;
  Lexeme *begin;
  IntrusiveList<SynShortFunctionArgument> arguments;
  IntrusiveList<SynBase> local_88;
  SynShortFunctionArgument *local_78;
  SynShortFunctionArgument *pSStack_70;
  IntrusiveList<SynShortFunctionArgument> local_68;
  Lexeme *local_50;
  SynBase *local_48;
  SynBase *pSStack_40;
  SynShortFunctionDefinition *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  local_50 = ctx->currentLexeme;
  if (local_50->type == lex_less) {
    ctx->currentLexeme = local_50 + 1;
    local_68.head = (SynShortFunctionArgument *)0x0;
    local_68.tail = (SynShortFunctionArgument *)0x0;
    if (local_50[1].type != lex_greater) {
      while( true ) {
        begin = ctx->currentLexeme;
        local_78 = (SynShortFunctionArgument *)ParseType(ctx,(bool *)0x0,false);
        if (ctx->currentLexeme->type != lex_string) {
          ctx->currentLexeme = begin;
          local_78 = (SynShortFunctionArgument *)0x0;
        }
        pcVar5 = "ERROR: function argument name not found after \',\'";
        if (local_68.head == (SynShortFunctionArgument *)0x0) {
          pcVar5 = "ERROR: function argument name not found after \'<\'";
        }
        bVar2 = anon_unknown.dwarf_16d1cf::CheckAt(ctx,lex_string,pcVar5);
        pLVar4 = ctx->currentLexeme;
        if (bVar2) {
          pcVar5 = pLVar4->pos;
          uVar1 = pLVar4->length;
          if (pLVar4->type != lex_none) {
            ctx->currentLexeme = pLVar4 + 1;
          }
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00222e15;
          pLVar4 = ctx->currentLexeme + -1;
          SynBase::SynBase((SynBase *)this,4,pLVar4,pLVar4);
          (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
          (this->name).begin = pcVar5;
          (this->name).end = pcVar5 + uVar1;
        }
        else {
          if (pLVar4 <= ctx->firstLexeme) goto LAB_00222e15;
          begin = pLVar4 + -1;
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
          this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
          (this->super_SynBase).typeID = 4;
          (this->super_SynBase).begin = (Lexeme *)0x0;
          (this->super_SynBase).end = (Lexeme *)0x0;
          (this->super_SynBase).pos.begin = (char *)0x0;
          (this->super_SynBase).pos.end = (char *)0x0;
          *(undefined8 *)((long)&(this->super_SynBase).pos.end + 2) = 0;
          *(undefined8 *)((long)&(this->super_SynBase).next + 2) = 0;
          (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f6178;
          (this->name).begin = (char *)0x0;
          (this->name).end = (char *)0x0;
        }
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        node = (SynShortFunctionArgument *)CONCAT44(extraout_var_01,iVar3);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_00222e15;
        SynBase::SynBase((SynBase *)node,0x38,begin,ctx->currentLexeme + -1);
        (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f8148;
        node->type = &local_78->super_SynBase;
        node->name = this;
        IntrusiveList<SynShortFunctionArgument>::push_back(&local_68,node);
        if (ctx->currentLexeme->type != lex_comma) break;
        ctx->currentLexeme = ctx->currentLexeme + 1;
      }
    }
    anon_unknown.dwarf_16d1cf::CheckConsume
              (ctx,lex_greater,"ERROR: \'>\' expected after short inline function argument list");
    local_88 = (IntrusiveList<SynBase>)ZEXT816(0);
    if (ctx->currentLexeme->type == lex_ofigure) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      local_88 = ParseExpressions(ctx);
      anon_unknown.dwarf_16d1cf::CheckConsume
                (ctx,lex_cfigure,"ERROR: \'}\' not found after function body");
    }
    else {
      node_00 = ParseStatement(ctx);
      if ((node_00 == (SynBase *)0x0) && (node_00 = ParseAssignment(ctx), node_00 == (SynBase *)0x0)
         ) {
        anon_unknown.dwarf_16d1cf::Report
                  (ctx,ctx->currentLexeme,"ERROR: expression not found after function header");
      }
      else {
        IntrusiveList<SynBase>::push_back(&local_88,node_00);
      }
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this_00 = (SynShortFunctionDefinition *)CONCAT44(extraout_var_02,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_00222e15:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_78 = local_68.head;
    pSStack_70 = local_68.tail;
    local_48 = local_88.head;
    pSStack_40 = local_88.tail;
    SynBase::SynBase((SynBase *)this_00,0x39,local_50,ctx->currentLexeme + -1);
    (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003f8180;
    (this_00->arguments).head = local_78;
    (this_00->arguments).tail = pSStack_70;
    (this_00->expressions).head = local_48;
    (this_00->expressions).tail = pSStack_40;
  }
  else {
    this_00 = (SynShortFunctionDefinition *)0x0;
  }
  return this_00;
}

Assistant:

SynShortFunctionDefinition* ParseShortFunctionDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_less))
	{
		IntrusiveList<SynShortFunctionArgument> arguments;

		bool isFirst = true;

		do
		{
			if(isFirst && ctx.At(lex_greater))
				break;

			isFirst = false;

			Lexeme *pos = ctx.currentLexeme;

			Lexeme *lexeme = ctx.currentLexeme;

			SynBase *type = ParseType(ctx);

			if(!ctx.At(lex_string))
			{
				// Backtrack
				ctx.currentLexeme = lexeme;

				type = NULL;
			}

			bool hasName = false;

			if(arguments.empty())
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after '<'");
			else
				hasName = CheckAt(ctx, lex_string, "ERROR: function argument name not found after ','");

			SynIdentifier *nameIdentifier = NULL;

			if(hasName)
			{
				InplaceStr name = ctx.Consume();
				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
			}
			else
			{
				pos = ctx.Previous();

				nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
			}

			arguments.push_back(new (ctx.get<SynShortFunctionArgument>()) SynShortFunctionArgument(pos, ctx.Previous(), type, nameIdentifier));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_greater, "ERROR: '>' expected after short inline function argument list");

		IntrusiveList<SynBase> expressions;

		if(ctx.Consume(lex_ofigure))
		{
			expressions = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after function body");
		}
		else if(SynBase *body = ParseStatement(ctx))
		{
			expressions.push_back(body);
		}
		else if(SynBase *body = ParseAssignment(ctx))
		{
			expressions.push_back(body);
		}
		else
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after function header");
		}

		return new (ctx.get<SynShortFunctionDefinition>()) SynShortFunctionDefinition(start, ctx.Previous(), arguments, expressions);
	}

	return NULL;
}